

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::endpoint_to_bytes_abi_cxx11_(string *__return_storage_ptr__,aux *this,endpoint *ep)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  endpoint *ep_local;
  string *ret;
  
  out.container._7_1_ = 0;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::back_insert_iterator(&local_28,__return_storage_ptr__);
  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::back_insert_iterator<std::__cxx11::string>&>
            ((basic_endpoint<boost::asio::ip::udp> *)this,&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string endpoint_to_bytes(udp::endpoint const& ep)
	{
		std::string ret;
		std::back_insert_iterator<std::string> out(ret);
		aux::write_endpoint(ep, out);
		return ret;
	}